

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5AllocateSegid(Fts5Index *p,Fts5Structure *pStruct)

{
  int iVar1;
  int iVar2;
  int iId;
  u32 mask;
  int i;
  int iSeg;
  int iLvl;
  u32 aUsed [63];
  int iSegid;
  Fts5Structure *pStruct_local;
  Fts5Index *p_local;
  
  aUsed[0x3d] = 0;
  if (p->rc == 0) {
    if (pStruct->nSegment < 2000) {
      unique0x1000019a = pStruct;
      memset(&iSeg,0,0xfc);
      for (i = 0; i < stack0xffffffffffffffe8->nLevel; i = i + 1) {
        for (mask = 0; (int)mask < stack0xffffffffffffffe8->aLevel[i].nSeg; mask = mask + 1) {
          iVar1 = stack0xffffffffffffffe8->aLevel[i].aSeg[(int)mask].iSegid;
          if ((iVar1 < 0x7d1) && (0 < iVar1)) {
            iVar2 = (iVar1 + -1) / 0x20;
            (&iSeg)[iVar2] = 1 << ((byte)((long)(iVar1 + -1) % 0x20) & 0x1f) | (&iSeg)[iVar2];
          }
        }
      }
      for (iId = 0; (&iSeg)[iId] == -1; iId = iId + 1) {
      }
      aUsed[0x3d] = 0;
      while (((&iSeg)[iId] & 1 << ((byte)aUsed[0x3d] & 0x1f)) != 0) {
        aUsed[0x3d] = aUsed[0x3d] + 1;
      }
      aUsed[0x3d] = iId * 0x20 + 1 + aUsed[0x3d];
    }
    else {
      p->rc = 0xd;
    }
  }
  return aUsed[0x3d];
}

Assistant:

static int fts5AllocateSegid(Fts5Index *p, Fts5Structure *pStruct){
  int iSegid = 0;

  if( p->rc==SQLITE_OK ){
    if( pStruct->nSegment>=FTS5_MAX_SEGMENT ){
      p->rc = SQLITE_FULL;
    }else{
      /* FTS5_MAX_SEGMENT is currently defined as 2000. So the following
      ** array is 63 elements, or 252 bytes, in size.  */
      u32 aUsed[(FTS5_MAX_SEGMENT+31) / 32];
      int iLvl, iSeg;
      int i;
      u32 mask;
      memset(aUsed, 0, sizeof(aUsed));
      for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          int iId = pStruct->aLevel[iLvl].aSeg[iSeg].iSegid;
          if( iId<=FTS5_MAX_SEGMENT && iId>0 ){
            aUsed[(iId-1) / 32] |= (u32)1 << ((iId-1) % 32);
          }
        }
      }

      for(i=0; aUsed[i]==0xFFFFFFFF; i++);
      mask = aUsed[i];
      for(iSegid=0; mask & ((u32)1 << iSegid); iSegid++);
      iSegid += 1 + i*32;

#ifdef SQLITE_DEBUG
      for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          assert_nc( iSegid!=pStruct->aLevel[iLvl].aSeg[iSeg].iSegid );
        }
      }
      assert_nc( iSegid>0 && iSegid<=FTS5_MAX_SEGMENT );

      {
        sqlite3_stmt *pIdxSelect = fts5IdxSelectStmt(p);
        if( p->rc==SQLITE_OK ){
          u8 aBlob[2] = {0xff, 0xff};
          sqlite3_bind_int(pIdxSelect, 1, iSegid);
          sqlite3_bind_blob(pIdxSelect, 2, aBlob, 2, SQLITE_STATIC);
          assert_nc( sqlite3_step(pIdxSelect)!=SQLITE_ROW );
          p->rc = sqlite3_reset(pIdxSelect);
          sqlite3_bind_null(pIdxSelect, 2);
        }
      }
#endif
    }
  }

  return iSegid;
}